

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes31Context.cpp
# Opt level: O3

void __thiscall deqp::gles31::Context::Context(Context *this,TestContext *testCtx)

{
  RunMode RVar1;
  RenderContext *pRVar2;
  
  this->m_testCtx = testCtx;
  this->m_renderCtx = (RenderContext *)0x0;
  this->m_contextInfo = (ContextInfo *)0x0;
  RVar1 = tcu::CommandLine::getRunMode(testCtx->m_cmdLine);
  if (RVar1 != RUNMODE_EXECUTE) {
    pRVar2 = (RenderContext *)operator_new(0x1a58);
    pRVar2->_vptr_RenderContext = (_func_int **)&PTR__DummyRenderContext_02151b18;
    *(undefined4 *)&pRVar2[1]._vptr_RenderContext = 0x13;
    tcu::RenderTarget::RenderTarget((RenderTarget *)((long)&pRVar2[1]._vptr_RenderContext + 4));
    glw::Functions::Functions((Functions *)(pRVar2 + 6));
    this->m_renderCtx = pRVar2;
    return;
  }
  createRenderContext(this);
  return;
}

Assistant:

Context::Context (tcu::TestContext& testCtx)
	: m_testCtx		(testCtx)
	, m_renderCtx	(DE_NULL)
	, m_contextInfo	(DE_NULL)
{
	if (m_testCtx.getCommandLine().getRunMode() == tcu::RUNMODE_EXECUTE)
		createRenderContext();
	else
	{
		// \todo [2016-11-15 pyry] Many tests (erroneously) inspect context type
		//						   during test hierarchy construction. We should fix that
		//						   and revert dummy context to advertise unknown context type.
		m_renderCtx = new glu::DummyRenderContext(glu::ContextType(glu::ApiType::es(3,1)));
	}
}